

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_explode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pVal;
  jx9_value *pValue;
  int iVar1;
  sxi32 sVar2;
  int iVar3;
  char *zString;
  jx9_value *pArray;
  char *pcVar4;
  SyBlob *pBlob;
  sxu32 nLen;
  ulong uVar5;
  int nDelim;
  sxu32 nOfft;
  int nStrlen;
  int local_60;
  sxu32 local_5c;
  jx9_value *local_58;
  uint local_4c;
  jx9_context *local_48;
  char *local_40;
  int local_34;
  
  if ((1 < nArg) && (local_40 = jx9_value_to_string(*apArg,(int *)&local_5c), 0 < (int)local_5c)) {
    zString = jx9_value_to_string(apArg[1],&local_34);
    if (0 < (long)local_34) {
      pArray = jx9_context_new_array(pCtx);
      local_58 = jx9_context_new_scalar(pCtx);
      if (local_58 != (jx9_value *)0x0 && pArray != (jx9_value *)0x0) {
        local_60 = 0x7fffffff;
        local_48 = pCtx;
        if (nArg != 2) {
          iVar1 = jx9_value_to_int(apArg[2]);
          iVar3 = -iVar1;
          if (0 < iVar1) {
            iVar3 = iVar1;
          }
          local_60 = iVar3 + -1 + (uint)(iVar3 == 0);
        }
        pVal = local_58;
        pcVar4 = zString + local_34;
        pBlob = &local_58->sBlob;
        do {
          if (pcVar4 <= zString) {
LAB_0012b353:
            jx9_result_value(local_48,pArray);
            return 0;
          }
          nLen = (int)pcVar4 - (int)zString;
          sVar2 = SyBlobSearch(zString,nLen,local_40,local_5c,&local_4c);
          pValue = local_58;
          if (sVar2 != 0) {
LAB_0012b333:
            jx9_value_string(local_58,zString,nLen);
            jx9_array_add_elem(pArray,(jx9_value *)0x0,pValue);
            goto LAB_0012b353;
          }
          iVar3 = 0;
          if ((pArray->iFlags & 0x40) != 0) {
            iVar3 = *(int *)((pArray->x).iVal + 0x2c);
          }
          if (local_60 <= iVar3) goto LAB_0012b333;
          uVar5 = (ulong)local_4c;
          if (uVar5 != 0) {
            jx9_value_string(pVal,zString,local_4c);
            jx9_array_add_elem(pArray,(jx9_value *)0x0,pVal);
          }
          zString = zString + (long)(int)local_5c + uVar5;
          SyBlobReset(pBlob);
        } while( true );
      }
    }
  }
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_explode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zDelim, *zString, *zCur, *zEnd;
	int nDelim, nStrlen, iLimit;
	jx9_value *pArray;
	jx9_value *pValue;
	sxu32 nOfft;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the delimiter */
	zDelim = jx9_value_to_string(apArg[0], &nDelim);
	if( nDelim < 1 ){
		/* Empty delimiter, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the string */
	zString = jx9_value_to_string(apArg[1], &nStrlen);
	if( nStrlen < 1 ){
		/* Empty delimiter, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the end of the string */
	zEnd = &zString[nStrlen];
	/* Create the array */
	pArray =  jx9_context_new_array(pCtx);
	pValue = jx9_context_new_scalar(pCtx);
	if( pArray == 0 || pValue == 0 ){
		/* Out of memory, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Set a defualt limit */
	iLimit = SXI32_HIGH;
	if( nArg > 2 ){
		iLimit = jx9_value_to_int(apArg[2]);
		 if( iLimit < 0 ){
			iLimit = -iLimit;
		}
		if( iLimit == 0 ){
			iLimit = 1;
		}
		iLimit--;
	}
	/* Start exploding */
	for(;;){
		if( zString >= zEnd ){
			/* No more entry to process */
			break;
		}
		rc = SyBlobSearch(zString, (sxu32)(zEnd-zString), zDelim, nDelim, &nOfft);
		if( rc != SXRET_OK || iLimit <= (int)jx9_array_count(pArray) ){
			/* Limit reached, insert the rest of the string and break */
			if( zEnd > zString ){
				jx9_value_string(pValue, zString, (int)(zEnd-zString));
				jx9_array_add_elem(pArray, 0/* Automatic index assign*/, pValue);
			}
			break;
		}
		/* Point to the desired offset */
		zCur = &zString[nOfft];
		if( zCur > zString ){
			/* Perform the store operation */
			jx9_value_string(pValue, zString, (int)(zCur-zString));
			jx9_array_add_elem(pArray, 0/* Automatic index assign*/, pValue);
		}
		/* Point beyond the delimiter */
		zString = &zCur[nDelim];
		/* Reset the cursor */
		jx9_value_reset_string_cursor(pValue);
	}
	/* Return the freshly created array */
	jx9_result_value(pCtx, pArray);
	/* NOTE that every allocated jx9_value will be automatically 
	 * released as soon we return from this foregin function.
	 */
	return JX9_OK;
}